

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  PyObject *pPVar1;
  size_t sVar2;
  byte extraout_AL;
  byte bVar3;
  int iVar4;
  undefined1 *this_00;
  iterator iVar5;
  PyTypeObject *pPVar6;
  mapped_type __s;
  internals *piVar7;
  mapped_type *pmVar8;
  mapped_type *pptVar9;
  vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *pvVar10;
  ulong uVar11;
  long lVar12;
  object *poVar13;
  type_info *ptVar14;
  long *plVar15;
  error_already_set *this_01;
  size_type *psVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  internals *piVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  type_index tindex;
  allocator<char> local_89;
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pPVar1 = (rec->scope).m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    iVar4 = PyObject_HasAttrString(pPVar1,rec->name);
    if (iVar4 == 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,rec->name,&local_89);
      std::operator+(&local_68,"generic_type: cannot initialize type \"",&local_48);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_88._0_8_ = *plVar15;
      psVar16 = (size_type *)(plVar15 + 2);
      if ((size_type *)local_88._0_8_ == psVar16) {
        local_88._16_8_ = *psVar16;
        local_88._24_8_ = plVar15[3];
        local_88._0_8_ = local_88 + 0x10;
      }
      else {
        local_88._16_8_ = *psVar16;
      }
      local_88._8_8_ = plVar15[1];
      *plVar15 = (long)psVar16;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      pybind11_fail((string *)local_88);
    }
  }
  piVar17 = (internals *)rec->type;
  if ((rec->field_0x60 & 0x10) == 0) {
    __k = &local_68;
    local_68._M_dataplus._M_p = (pointer)piVar17;
    this_00 = (undefined1 *)get_internals();
  }
  else {
    local_88._0_8_ = piVar17;
    if (registered_local_types_cpp()::locals == '\0') {
      initialize();
    }
    this_00 = registered_local_types_cpp()::locals;
    __k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  }
  iVar5 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this_00,(key_type *)__k);
  if ((iVar5.
       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                      ._M_cur + 0x10) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,rec->name,&local_89);
    std::operator+(&local_68,"generic_type: type \"",&local_48);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_88._0_8_ = *plVar15;
    psVar16 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_88._0_8_ == psVar16) {
      local_88._16_8_ = *psVar16;
      local_88._24_8_ = plVar15[3];
      local_88._0_8_ = local_88 + 0x10;
    }
    else {
      local_88._16_8_ = *psVar16;
    }
    local_88._8_8_ = plVar15[1];
    *plVar15 = (long)psVar16;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    pybind11_fail((string *)local_88);
  }
  pPVar6 = (PyTypeObject *)make_new_python_type(rec);
  (this->super_object).super_handle.m_ptr = (PyObject *)pPVar6;
  __s = (mapped_type)operator_new(0x98);
  memset(__s,0,0x98);
  __s->type = pPVar6;
  __s->cpptype = rec->type;
  __s->type_size = rec->type_size;
  __s->type_align = rec->type_align;
  __s->operator_new = rec->operator_new;
  sVar2 = rec->holder_size;
  log2((detail *)0x8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  __s->holder_size_in_ptrs = (sVar2 - 1 >> (extraout_AL & 0x3f)) + 1;
  __s->init_instance = rec->init_instance;
  __s->dealloc = rec->dealloc;
  bVar3 = __s->field_0x90;
  __s->field_0x90 = bVar3 | 3;
  __s->field_0x90 = (byte)rec->field_0x60 >> 1 & 0xc | bVar3 & 0xf3 | 3;
  piVar7 = get_internals();
  local_68._M_dataplus._M_p = (pointer)rec->type;
  pmVar8 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&piVar7->direct_conversions,(key_type *)&local_68);
  __s->direct_conversions = pmVar8;
  piVar17 = piVar7;
  if ((rec->field_0x60 & 0x10) != 0) {
    if (registered_local_types_cpp()::locals == '\0') {
      initialize((generic_type *)local_88);
      piVar17 = (internals *)local_88._0_8_;
    }
    else {
      piVar17 = (internals *)registered_local_types_cpp()::locals;
    }
  }
  pptVar9 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)piVar17,(key_type *)&local_68);
  *pptVar9 = __s;
  local_48._M_dataplus._M_p = (pointer)(this->super_object).super_handle.m_ptr;
  local_88._0_8_ = __s;
  pvVar10 = (vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *)
            std::__detail::
            _Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&piVar7->registered_types_py,(key_type *)&local_48);
  std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>::
  _M_assign_aux<pybind11::detail::type_info*const*>(pvVar10,local_88,local_88 + 8);
  uVar11 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
  if ((uVar11 < 2) && ((rec->field_0x60 & 1) == 0)) {
    lVar12 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
    if (lVar12 != 1) goto LAB_00111d05;
    local_88._8_8_ = (rec->bases).super_object.super_handle.m_ptr;
    local_88._16_8_ = 0;
    local_88._24_8_ = 0;
    poVar13 = accessor<pybind11::detail::accessor_policies::list_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::list_item> *)local_88);
    ptVar14 = get_type_info((PyTypeObject *)(poVar13->super_handle).m_ptr);
    object::~object((object *)(local_88 + 0x18));
    bVar3 = __s->field_0x90 & 0xfd | ptVar14->field_0x90 & 2;
  }
  else {
    mark_parents_nonsimple(this,__s->type);
    bVar3 = __s->field_0x90 & 0xfd;
  }
  __s->field_0x90 = bVar3;
LAB_00111d05:
  if ((rec->field_0x60 & 0x10) != 0) {
    __s->module_local_load = type_caster_generic::local_load;
    pPVar1 = (this->super_object).super_handle.m_ptr;
    capsule::capsule((capsule *)local_88,__s,(char *)0x0,(_func_void_PyObject_ptr *)0x0);
    iVar4 = PyObject_SetAttrString
                      (pPVar1,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__",
                       local_88._0_8_);
    if (iVar4 != 0) {
      this_01 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_01);
      __cxa_throw(this_01,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    object::~object((object *)local_88);
  }
  return;
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, rec.name))
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name) +
                          "\": an object with that name is already defined");

        if (rec.module_local ? get_local_type_info(*rec.type) : get_global_type_info(*rec.type))
            pybind11_fail("generic_type: type \"" + std::string(rec.name) +
                          "\" is already registered!");

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->type_align = rec.type_align;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_instance = rec.init_instance;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;
        tinfo->default_holder = rec.default_holder;
        tinfo->module_local = rec.module_local;

        auto &internals = get_internals();
        auto tindex = std::type_index(*rec.type);
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        if (rec.module_local)
            registered_local_types_cpp()[tindex] = tinfo;
        else
            internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[(PyTypeObject *) m_ptr] = { tinfo };

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        }
        else if (rec.bases.size() == 1) {
            auto parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            tinfo->simple_ancestors = parent_tinfo->simple_ancestors;
        }

        if (rec.module_local) {
            // Stash the local typeinfo and loader so that external modules can access it.
            tinfo->module_local_load = &type_caster_generic::local_load;
            setattr(m_ptr, PYBIND11_MODULE_LOCAL_ID, capsule(tinfo));
        }
    }